

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O3

int xmlGcMemSetup(xmlFreeFunc freeFunc,xmlMallocFunc mallocFunc,xmlMallocFunc mallocAtomicFunc,
                 xmlReallocFunc reallocFunc,xmlStrdupFunc strdupFunc)

{
  int iVar1;
  undefined4 in_R9D;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(freeFunc == (xmlFreeFunc)0x0);
  auVar3._4_4_ = -(uint)(mallocFunc == (xmlMallocFunc)0x0);
  auVar3._8_4_ = -(uint)(mallocAtomicFunc == (xmlMallocFunc)0x0);
  auVar3._12_4_ = -(uint)(reallocFunc == (xmlReallocFunc)0x0);
  iVar2 = movmskps(in_R9D,auVar3);
  iVar1 = -1;
  if (iVar2 == 0 && strdupFunc != (xmlStrdupFunc)0x0) {
    iVar1 = 0;
    xmlFree = freeFunc;
    xmlMalloc = mallocFunc;
    xmlMallocAtomic = mallocAtomicFunc;
    xmlRealloc = reallocFunc;
    xmlMemStrdup = strdupFunc;
  }
  return iVar1;
}

Assistant:

int
xmlGcMemSetup(xmlFreeFunc freeFunc, xmlMallocFunc mallocFunc,
              xmlMallocFunc mallocAtomicFunc, xmlReallocFunc reallocFunc,
	      xmlStrdupFunc strdupFunc) {
    if (freeFunc == NULL)
	return(-1);
    if (mallocFunc == NULL)
	return(-1);
    if (mallocAtomicFunc == NULL)
	return(-1);
    if (reallocFunc == NULL)
	return(-1);
    if (strdupFunc == NULL)
	return(-1);
    xmlFree = freeFunc;
    xmlMalloc = mallocFunc;
    xmlMallocAtomic = mallocAtomicFunc;
    xmlRealloc = reallocFunc;
    xmlMemStrdup = strdupFunc;
    return(0);
}